

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramQueryCase::iterate
          (GeometryProgramQueryCase *this)

{
  size_type *psVar1;
  ulong uVar2;
  Functions *pFVar3;
  TestLog *pTVar4;
  RenderContext *pRVar5;
  TestContext *this_00;
  bool bVar6;
  ContextType CVar7;
  GLSLVersion GVar8;
  int iVar9;
  int iVar10;
  deUint32 dVar11;
  char *pcVar12;
  long *plVar13;
  undefined4 extraout_var;
  long *plVar14;
  undefined8 *puVar15;
  TestError *this_01;
  size_type *psVar16;
  Functions *pFVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  char *pcVar19;
  glActiveShaderProgramFunc p_Var20;
  undefined8 uVar21;
  long lVar22;
  long lVar23;
  string geometrySource;
  ScopedLogSection section;
  char *vtxSourcePtr;
  char *fragSourcePtr;
  string vertexSource;
  ScopedLogSection section_1;
  string fragmentSource;
  Shader fragmentShader;
  StateQueryMemoryWriteGuard<int> state;
  ShaderProgram program;
  char *geomSourcePtr;
  ShaderProgram program_1;
  string local_438;
  ScopedLogSection local_418;
  string local_410;
  long *local_3f0;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  long lStack_3d0;
  undefined1 local_3c8 [8];
  value_type local_3c0;
  long *local_388;
  long local_380;
  long local_378;
  long lStack_370;
  undefined1 local_368 [8];
  undefined1 local_360 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_350 [4];
  bool local_310;
  GeometryProgramQueryCase *local_300;
  undefined1 local_2f8 [8];
  undefined1 local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0 [4];
  bool local_2a0;
  undefined1 local_290 [88];
  bool local_238;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  bool bStack_1d0;
  undefined8 uStack_1cf;
  long local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  undefined1 local_1b0 [8];
  pointer local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  bool bStack_f0;
  undefined8 uStack_ef;
  
  CVar7.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(CVar7,(ApiType)0x23);
  CVar7.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar8 = glu::getContextTypeGLSLVersion(CVar7);
  pcVar12 = glu::getGLSLVersionDeclaration(GVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,pcVar12,(allocator<char> *)local_290);
  plVar13 = (long *)std::__cxx11::string::append(local_1b0);
  local_3e8 = &local_3d8;
  plVar14 = plVar13 + 2;
  if ((long *)*plVar13 == plVar14) {
    local_3d8 = *plVar14;
    lStack_3d0 = plVar13[3];
  }
  else {
    local_3d8 = *plVar14;
    local_3e8 = (long *)*plVar13;
  }
  local_3e0 = plVar13[1];
  *plVar13 = (long)plVar14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  CVar7.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar8 = glu::getContextTypeGLSLVersion(CVar7);
  pcVar12 = glu::getGLSLVersionDeclaration(GVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,pcVar12,(allocator<char> *)local_290);
  plVar13 = (long *)std::__cxx11::string::append(local_1b0);
  local_388 = &local_378;
  plVar14 = plVar13 + 2;
  if ((long *)*plVar13 == plVar14) {
    local_378 = *plVar14;
    lStack_370 = plVar13[3];
  }
  else {
    local_378 = *plVar14;
    local_388 = (long *)*plVar13;
  }
  local_380 = plVar13[1];
  *plVar13 = (long)plVar14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  if (0 < (int)((ulong)((long)(this->m_cases).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_cases).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar23 = 0;
    local_300 = this;
    do {
      pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_1b0 = (undefined1  [8])local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Case","");
      local_1c0 = lVar23;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_290,
                 (this->m_cases).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar23].description,
                 (allocator<char> *)local_368);
      tcu::ScopedLogSection::ScopedLogSection
                (&local_418,pTVar4,(string *)local_1b0,(string *)local_290);
      if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
      }
      pcVar12 = (this->m_cases).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar23].header;
      local_1b0 = (undefined1  [8])local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,
                 "void main ()\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tEmitVertex();\n}\n",
                 "");
      strlen(pcVar12);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,(ulong)pcVar12)
      ;
      psVar16 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_438.field_2._M_allocated_capacity = *psVar16;
        local_438.field_2._8_8_ = plVar13[3];
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      }
      else {
        local_438.field_2._M_allocated_capacity = *psVar16;
        local_438._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_438._M_string_length = plVar13[1];
      *plVar13 = (long)psVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
      }
      pRVar5 = ((local_300->super_TestCase).m_context)->m_renderCtx;
      bStack_f0 = false;
      uStack_ef = 0;
      local_100._M_allocated_capacity = 0;
      local_100._M_local_buf[8] = '\0';
      local_100._9_7_ = 0;
      memset(local_1b0,0,0xac);
      local_368 = (undefined1  [8])((ulong)local_368 & 0xffffffff00000000);
      local_360._0_8_ = aaStack_350;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_360,local_3e8,(long)local_3e8 + local_3e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_368 & 0xffffffff) * 0x18),(value_type *)local_360);
      local_2f8._0_4_ = 1;
      local_2f0._0_8_ = local_2e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f0,local_388,(long)local_388 + local_380);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_2f8 & 0xffffffff) * 0x18),(value_type *)local_2f0);
      this = local_300;
      iVar9 = (*((local_300->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      local_3f0 = (long *)CONCAT44(local_3f0._4_4_,iVar9);
      specializeShader(&local_410,&local_438,(ContextType *)&local_3f0);
      local_3c8._0_4_ = 2;
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c0,local_410._M_dataplus._M_p,
                 local_410._M_dataplus._M_p + local_410._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_3c8 & 0xffffffff) * 0x18),&local_3c0);
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_290,pRVar5,(ProgramSources *)local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._0_8_ != local_2e0) {
        operator_delete((void *)local_2f0._0_8_,local_2e0[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._0_8_ != aaStack_350) {
        operator_delete((void *)local_360._0_8_,
                        CONCAT44(aaStack_350[0]._M_allocated_capacity._4_4_,
                                 (undefined4)aaStack_350[0]._M_allocated_capacity) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_100);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_120);
      lVar22 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + lVar22));
        lVar22 = lVar22 + -0x18;
      } while (lVar22 != -0x18);
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      (ShaderProgram *)local_290);
      dVar11 = (deUint32)
               local_200.
               super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar9 = (this->m_cases).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar23].value;
      iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      local_2f8 = (undefined1  [8])0xdededededededede;
      local_2f0._0_4_ = 0xdededede;
      (**(code **)(CONCAT44(extraout_var,iVar10) + 0x9d8))(dVar11,this->m_target,local_2f8 + 4);
      dVar11 = (**(code **)(CONCAT44(extraout_var,iVar10) + 0x800))();
      glu::checkError(dVar11,"getProgramiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                      ,0xfd6);
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      local_368 = (undefined1  [8])glu::getProgramParamName;
      local_360._0_4_ = this->m_target;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_368,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," = ",3);
      std::ostream::operator<<((ostringstream *)&local_1a8,local_2f8._4_4_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      if (local_2f8._4_4_ != iVar9) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"// ERROR: Expected ",0x13);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", got ",6);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_2f8._4_4_);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        if (this_00->m_testResult == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,"got invalid value");
        }
      }
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      tcu::TestLog::endSection(local_418.m_log);
      lVar23 = local_1c0 + 1;
    } while (lVar23 < (int)((ulong)((long)(this->m_cases).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_cases).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"NoGeometryShader","");
  local_290._0_8_ = local_290 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"No geometry shader","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)local_3c8,pTVar4,(string *)local_1b0,(string *)local_290);
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  bStack_1d0 = false;
  uStack_1cf = 0;
  local_1e0._M_allocated_capacity = 0;
  local_1e0._M_local_buf[8] = '\0';
  local_1e0._9_7_ = 0;
  memset(local_290,0,0xac);
  local_368 = (undefined1  [8])((ulong)local_368 & 0xffffffff00000000);
  local_360._0_8_ = aaStack_350;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_360,local_3e8,(long)local_3e8 + local_3e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_290 + ((ulong)local_368 & 0xffffffff) * 0x18),(value_type *)local_360);
  local_2f8._0_4_ = 1;
  local_2f0._0_8_ = local_2e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2f0,local_388,(long)local_388 + local_380);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_290 + ((ulong)local_2f8 & 0xffffffff) * 0x18),(value_type *)local_2f0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1b0,pRVar5,(ProgramSources *)local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._0_8_ != local_2e0) {
    operator_delete((void *)local_2f0._0_8_,local_2e0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._0_8_ != aaStack_350) {
    operator_delete((void *)local_360._0_8_,
                    CONCAT44(aaStack_350[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_350[0]._M_allocated_capacity) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1e0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_200);
  lVar23 = 0x78;
  plVar13 = (long *)(local_290 + 0x10);
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_290 + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)local_1b0);
  expectQueryError(this,(deUint32)
                        local_120.
                        super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1b0);
  tcu::TestLog::endSection((TestLog *)local_3c8);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"NotLinkedProgram","");
  local_290._0_8_ = plVar13;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,"Shader program not linked","");
  tcu::ScopedLogSection::ScopedLogSection(&local_418,pTVar4,(string *)local_1b0,(string *)local_290)
  ;
  if ((long *)local_290._0_8_ != plVar13) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  CVar7.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar8 = glu::getContextTypeGLSLVersion(CVar7);
  pcVar12 = glu::getGLSLVersionDeclaration(GVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,pcVar12,(allocator<char> *)&local_3f0);
  plVar14 = (long *)std::__cxx11::string::append(local_2f8);
  pFVar3 = (Functions *)(local_360 + 8);
  pFVar17 = (Functions *)(plVar14 + 2);
  if ((Functions *)*plVar14 == pFVar17) {
    local_360._8_8_ = pFVar17->activeShaderProgram;
    aaStack_350[0]._0_4_ = (undefined4)plVar14[3];
    aaStack_350[0]._4_4_ = *(undefined4 *)((long)plVar14 + 0x1c);
    local_368 = (undefined1  [8])pFVar3;
  }
  else {
    local_360._8_8_ = pFVar17->activeShaderProgram;
    local_368 = (undefined1  [8])*plVar14;
  }
  pcVar12 = "#extension GL_EXT_geometry_shader : require\n";
  if (bVar6) {
    pcVar12 = "";
  }
  local_360._0_8_ = plVar14[1];
  *plVar14 = (long)pFVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  psVar16 = &local_3c0._M_string_length;
  pcVar19 = pcVar12 + 0x2c;
  if (bVar6) {
    pcVar19 = pcVar12;
  }
  local_3c8 = (undefined1  [8])psVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,pcVar12,pcVar19);
  p_Var20 = (glActiveShaderProgramFunc)0xf;
  if (local_368 != (undefined1  [8])pFVar3) {
    p_Var20 = (glActiveShaderProgramFunc)local_360._8_8_;
  }
  if (p_Var20 < local_3c0._M_dataplus._M_p + local_360._0_8_) {
    p_Var20 = (glActiveShaderProgramFunc)0xf;
    if (local_3c8 != (undefined1  [8])psVar16) {
      p_Var20 = (glActiveShaderProgramFunc)local_3c0._M_string_length;
    }
    if (p_Var20 < local_3c0._M_dataplus._M_p + local_360._0_8_) goto LAB_013f842f;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)local_3c8,0,(char *)0x0,(ulong)local_368);
  }
  else {
LAB_013f842f:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_368,(ulong)local_3c8);
  }
  psVar1 = puVar15 + 2;
  if ((size_type *)*puVar15 == psVar1) {
    local_290._16_8_ = *psVar1;
    local_290._24_8_ = puVar15[3];
    local_290._0_8_ = plVar13;
  }
  else {
    local_290._16_8_ = *psVar1;
    local_290._0_8_ = (size_type *)*puVar15;
  }
  local_290._8_8_ = puVar15[1];
  *puVar15 = psVar1;
  puVar15[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_290);
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 == paVar18) {
    local_1a0[0]._0_8_ = paVar18->_M_allocated_capacity;
    local_1a0[0]._8_4_ = (undefined4)plVar13[3];
    local_1a0[0]._12_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
    local_1b0 = (undefined1  [8])local_1a0;
  }
  else {
    local_1a0[0]._0_8_ = paVar18->_M_allocated_capacity;
    local_1b0 = (undefined1  [8])*plVar13;
  }
  local_1a8 = (pointer)plVar13[1];
  *plVar13 = (long)paVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  paVar18 = &local_410.field_2;
  local_410._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_410,
             "void main ()\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tEmitVertex();\n}\n","");
  uVar2 = (long)&(local_1a8->_M_dataplus)._M_p + local_410._M_string_length;
  uVar21 = 0xf;
  if (local_1b0 != (undefined1  [8])local_1a0) {
    uVar21 = local_1a0[0]._M_allocated_capacity;
  }
  if ((ulong)uVar21 < uVar2) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar18) {
      uVar21 = local_410.field_2._M_allocated_capacity;
    }
    if (uVar2 <= (ulong)uVar21) {
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,(ulong)local_1b0);
      goto LAB_013f8594;
    }
  }
  puVar15 = (undefined8 *)
            std::__cxx11::string::_M_append(local_1b0,(ulong)local_410._M_dataplus._M_p);
LAB_013f8594:
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  psVar1 = puVar15 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_438.field_2._M_allocated_capacity = *psVar1;
    local_438.field_2._8_8_ = puVar15[3];
  }
  else {
    local_438.field_2._M_allocated_capacity = *psVar1;
    local_438._M_dataplus._M_p = (pointer)*puVar15;
  }
  local_438._M_string_length = puVar15[1];
  *puVar15 = psVar1;
  puVar15[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != paVar18) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if (local_3c8 != (undefined1  [8])psVar16) {
    operator_delete((void *)local_3c8,(ulong)(local_3c0._M_string_length + 1));
  }
  if (local_368 != (undefined1  [8])pFVar3) {
    operator_delete((void *)local_368,(ulong)(local_360._8_8_ + 1));
  }
  if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
    operator_delete((void *)local_2f8,local_2f0._8_8_ + 1);
  }
  local_410._M_dataplus._M_p = (pointer)local_3e8;
  local_3f0 = local_388;
  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p;
  glu::Shader::Shader((Shader *)local_290,((this->super_TestCase).m_context)->m_renderCtx,
                      SHADERTYPE_VERTEX);
  glu::Shader::Shader((Shader *)local_368,((this->super_TestCase).m_context)->m_renderCtx,
                      SHADERTYPE_FRAGMENT);
  glu::Shader::Shader((Shader *)local_2f8,((this->super_TestCase).m_context)->m_renderCtx,
                      SHADERTYPE_GEOMETRY);
  glu::Program::Program((Program *)local_3c8,((this->super_TestCase).m_context)->m_renderCtx);
  glu::Shader::setSources((Shader *)local_290,1,(char **)&local_410,(int *)0x0);
  glu::Shader::setSources((Shader *)local_368,1,(char **)&local_3f0,(int *)0x0);
  glu::Shader::setSources((Shader *)local_2f8,1,(char **)&local_1b8,(int *)0x0);
  glu::Shader::compile((Shader *)local_290);
  glu::Shader::compile((Shader *)local_368);
  glu::Shader::compile((Shader *)local_2f8);
  if (((local_238 == true) && (local_310 == true)) && (local_2a0 != false)) {
    glu::Program::attachShader((Program *)local_3c8,local_290._8_4_);
    glu::Program::attachShader((Program *)local_3c8,local_360._0_4_);
    glu::Program::attachShader((Program *)local_3c8,local_2f0._0_4_);
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Creating a program with geometry shader, but not linking it",
               0x3b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    expectQueryError(this,(deUint32)local_3c0._M_dataplus._M_p);
    glu::Program::~Program((Program *)local_3c8);
    glu::Shader::~Shader((Shader *)local_2f8);
    glu::Shader::~Shader((Shader *)local_368);
    glu::Shader::~Shader((Shader *)local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    tcu::TestLog::endSection(local_418.m_log);
    if (local_388 != &local_378) {
      operator_delete(local_388,local_378 + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Failed to compile shader","")
  ;
  tcu::TestError::TestError(this_01,(string *)local_1b0);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GeometryProgramQueryCase::IterateResult GeometryProgramQueryCase::iterate (void)
{
	const bool			supportsES32			= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	const std::string	vertexSource			= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
												  "void main ()\n"
												  "{\n"
												  "	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "}\n";
	const std::string	fragmentSource			= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
												  "layout(location = 0) out mediump vec4 fragColor;\n"
												  "void main ()\n"
												  "{\n"
												  "	fragColor = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "}\n";
	static const char*	s_geometryBody			="void main ()\n"
												  "{\n"
												  "	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "	EmitVertex();\n"
												  "}\n";

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// default cases
	for (int ndx = 0; ndx < (int)m_cases.size(); ++ndx)
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "Case", m_cases[ndx].description);
		const std::string			geometrySource	= m_cases[ndx].header + std::string(s_geometryBody);
		const glu::ShaderProgram	program			(m_context.getRenderContext(),
														glu::ProgramSources()
														<< glu::VertexSource(vertexSource)
														<< glu::FragmentSource(fragmentSource)
														<< glu::GeometrySource(specializeShader(geometrySource, m_context.getRenderContext().getType())));

		m_testCtx.getLog() << program;
		expectProgramValue(program.getProgram(), m_cases[ndx].value);
	}

	// no geometry shader -case (INVALID OP)
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "NoGeometryShader", "No geometry shader");
		const glu::ShaderProgram	program			(m_context.getRenderContext(),
														glu::ProgramSources()
														<< glu::VertexSource(vertexSource)
														<< glu::FragmentSource(fragmentSource));

		m_testCtx.getLog() << program;
		expectQueryError(program.getProgram());
	}

	// not linked -case (INVALID OP)
	{
		const tcu::ScopedLogSection section				(m_testCtx.getLog(), "NotLinkedProgram", "Shader program not linked");
		const std::string	geometrySource				= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
														+ std::string(supportsES32 ? "" : "#extension GL_EXT_geometry_shader : require\n")
														+ "layout (triangles) in;\n"
														"layout (points, max_vertices = 3) out;\n"
														+ std::string(s_geometryBody);


		const char* const			vtxSourcePtr	= vertexSource.c_str();
		const char* const			fragSourcePtr	= fragmentSource.c_str();
		const char* const			geomSourcePtr	= geometrySource.c_str();

		glu::Shader					vertexShader	(m_context.getRenderContext(), glu::SHADERTYPE_VERTEX);
		glu::Shader					fragmentShader	(m_context.getRenderContext(), glu::SHADERTYPE_FRAGMENT);
		glu::Shader					geometryShader	(m_context.getRenderContext(), glu::SHADERTYPE_GEOMETRY);
		glu::Program				program			(m_context.getRenderContext());

		vertexShader.setSources(1, &vtxSourcePtr, DE_NULL);
		fragmentShader.setSources(1, &fragSourcePtr, DE_NULL);
		geometryShader.setSources(1, &geomSourcePtr, DE_NULL);

		vertexShader.compile();
		fragmentShader.compile();
		geometryShader.compile();

		if (!vertexShader.getCompileStatus()   ||
			!fragmentShader.getCompileStatus() ||
			!geometryShader.getCompileStatus())
			throw tcu::TestError("Failed to compile shader");

		program.attachShader(vertexShader.getShader());
		program.attachShader(fragmentShader.getShader());
		program.attachShader(geometryShader.getShader());

		m_testCtx.getLog() << tcu::TestLog::Message << "Creating a program with geometry shader, but not linking it" << tcu::TestLog::EndMessage;

		expectQueryError(program.getProgram());
	}

	return STOP;
}